

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  anon_union_8_1_a8a14541_for_iterator_2 buffer;
  FieldDescriptor *field1;
  FieldDescriptor *field2;
  ushort *puVar1;
  ushort *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Context *pCVar8;
  bool bVar9;
  int iVar10;
  LogMessage *this_00;
  pointer ppFVar11;
  flat_hash_map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
  *this_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *pFVar12;
  string *info_00;
  ulong uVar13;
  FieldDescriptor *pFVar14;
  string_view name1;
  string_view name1_00;
  string_view str;
  string_view v;
  string_view str_00;
  string_view str_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view name2;
  string_view name2_00;
  difference_type __n;
  vector<bool,_std::allocator<bool>_> is_conflict;
  FieldDescriptor *field;
  FieldGeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  long local_1d8;
  undefined1 local_1c0 [48];
  vector<bool,_std::allocator<bool>_> local_190;
  undefined1 local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_128;
  char *local_120;
  FeatureSet *local_118;
  long local_110;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined4 local_e8;
  undefined2 local_e4;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined2 local_a0;
  Context *local_98;
  long local_90;
  FieldDescriptor *local_88;
  ulong local_80;
  ulong local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  FieldDescriptor *local_58;
  string local_50;
  
  local_148._M_dataplus._M_p = local_148._M_dataplus._M_p & 0xffffffffffffff00;
  local_98 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_190,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_148,
             (allocator_type *)local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_148);
  ppFVar11 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    local_88 = (FieldDescriptor *)0x1;
    local_90 = 0x20;
    pFVar12 = extraout_RDX;
    pFVar14 = (FieldDescriptor *)0x0;
    do {
      field1 = ppFVar11[(long)pFVar14];
      CapitalizedFieldName_abi_cxx11_((string *)local_1c0,(java *)field1,pFVar12);
      local_58 = (FieldDescriptor *)&pFVar14->field_0x1;
      ppFVar11 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if (local_58 <
          (undefined1 *)
          ((long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3)) {
        local_78 = 1L << ((byte)pFVar14 & 0x3f);
        local_80 = (ulong)pFVar14 >> 6;
        local_1d8 = local_90;
        pFVar12 = local_88;
        do {
          field2 = ppFVar11[(long)pFVar12];
          CapitalizedFieldName_abi_cxx11_((string *)local_168,(java *)field2,pFVar12);
          uVar7 = local_168._8_8_;
          uVar5 = local_1c0._8_8_;
          if ((local_1c0._8_8_ == local_168._8_8_) &&
             (((slot_type *)local_1c0._8_8_ == (slot_type *)0x0 ||
              (iVar10 = bcmp((void *)local_1c0._0_8_,(void *)local_168._0_8_,local_1c0._8_8_),
              iVar10 == 0)))) {
            local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[(ulong)pFVar12 >> 6] =
                 local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(ulong)pFVar12 >> 6] | 1L << ((byte)pFVar12 & 0x3f);
            local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_80] =
                 local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_80] |
                 local_78;
            puVar1 = (ushort *)(field1->all_names_).payload_;
            local_148.field_2._M_allocated_capacity = (size_type)*puVar1;
            puVar2 = (ushort *)(field2->all_names_).payload_;
            local_118 = (FeatureSet *)(ulong)*puVar2;
            local_148._M_dataplus._M_p = &DAT_0000001b;
            local_148._M_string_length = 0x138633a;
            pieces._M_len = (long)puVar1 + ~local_148.field_2._M_allocated_capacity;
            local_128 = (anon_union_8_2_3066aaf9_for_type_descriptor_)0x18;
            local_120 = "\" conflicts with field \"";
            local_110 = (long)puVar2 + ~(ulong)local_118;
            local_108.default_value_int64_t_ = 1;
            local_100 = "\"";
            pieces._M_array = (iterator)&DAT_00000005;
            local_148.field_2._8_8_ = pieces._M_len;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      (&local_50,(strings_internal *)&local_148,pieces);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&((local_70.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       local_1d8),(string *)&local_50);
            std::__cxx11::string::_M_assign
                      ((string *)
                       (local_70.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)pFVar14));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            uVar6 = local_168._0_8_;
            uVar4 = local_1c0._0_8_;
            info_00 = (string *)
                      ((long)&((local_70.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      local_1d8);
            name1._M_str = (char *)local_1c0._0_8_;
            name1._M_len = uVar5;
            name2._M_str = (char *)local_168._0_8_;
            name2._M_len = uVar7;
            bVar9 = anon_unknown_7::IsConflictingOneWay(field1,name1,field2,name2,info_00);
            if ((bVar9) ||
               (name1_00._M_str = (char *)uVar6, name1_00._M_len = uVar7,
               name2_00._M_str = (char *)uVar4, name2_00._M_len = uVar5,
               bVar9 = anon_unknown_7::IsConflictingOneWay(field2,name1_00,field1,name2_00,info_00),
               bVar9)) {
              local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[(ulong)pFVar12 >> 6] =
                   local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(ulong)pFVar12 >> 6] | 1L << ((byte)pFVar12 & 0x3f);
              local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[local_80] =
                   local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_80] |
                   local_78;
              std::__cxx11::string::_M_assign
                        ((string *)
                         (local_70.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)pFVar14));
            }
          }
          if ((FieldDescriptor *)local_168._0_8_ != (FieldDescriptor *)(local_168 + 0x10)) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          pFVar12 = (FieldDescriptor *)&pFVar12->field_0x1;
          ppFVar11 = (fields->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          local_1d8 = local_1d8 + 0x20;
        } while (pFVar12 < (undefined1 *)
                           ((long)(fields->
                                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3)
                );
      }
      if ((local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(ulong)pFVar14 >> 6] >> ((ulong)pFVar14 & 0x3f) &
          1) != 0) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/context.cc"
                   ,0xa3);
        str._M_str = "field \"";
        str._M_len = 7;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_148,str);
        pcVar3 = (field1->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar3 + 2);
        v._M_str = pcVar3 + ~v._M_len;
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            ((LogMessage *)&local_148,v);
        str_00._M_str = "\" is conflicting ";
        str_00._M_len = 0x11;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_00);
        str_01._M_str = "with another field: ";
        str_01._M_len = 0x14;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_01);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (this_00,local_70.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)pFVar14);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_148);
      }
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      ppFVar11 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      local_88 = (FieldDescriptor *)&local_88->field_0x1;
      local_90 = local_90 + 0x20;
      pFVar12 = local_58;
      pFVar14 = local_58;
    } while (local_58 <
             (FieldDescriptor *)
             ((long)(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >> 3));
  }
  pCVar8 = local_98;
  ppFVar11 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar11) {
    pFVar12 = (FieldDescriptor *)&(local_98->options_).output_list_file;
    this_01 = &local_98->field_generator_info_map_;
    uVar13 = 0;
    do {
      local_e0 = &local_d0;
      local_108.default_value_enum_ = (EnumValueDescriptor *)&local_f8;
      local_168._0_8_ = ppFVar11[uVar13];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      local_148._M_string_length = 0;
      local_148.field_2._M_allocated_capacity =
           local_148.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_120 = (char *)0x0;
      local_118 = (FeatureSet *)((ulong)local_118 & 0xffffffffffffff00);
      local_100 = (char *)0x0;
      local_f8 = 0;
      local_e8 = 0;
      local_e4 = 1;
      local_d8 = 0;
      local_d0 = 0;
      local_c0 = &local_b0;
      local_b8 = 0;
      local_b0 = 0;
      local_a0 = 0x100;
      local_128.message_type = (Descriptor *)&local_118;
      CamelCaseFieldName_abi_cxx11_((string *)local_1c0,(java *)local_168._0_8_,pFVar12);
      std::__cxx11::string::operator=((string *)&local_148,(string *)local_1c0);
      pFVar12 = extraout_RDX_00;
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        pFVar12 = extraout_RDX_01;
      }
      CapitalizedFieldName_abi_cxx11_((string *)local_1c0,(java *)local_168._0_8_,pFVar12);
      std::__cxx11::string::operator=((string *)&local_128,(string *)local_1c0);
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      if ((local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0) {
        buffer.slot_ = (slot_type *)(local_1c0 + 0x10);
        local_1c0._0_8_ =
             absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(int *)(local_168._0_8_ + 4),(Nonnull<char_*>)buffer.slot_);
        local_1c0._0_8_ = local_1c0._0_8_ + -(long)buffer.slot_;
        local_1c0._8_8_ = buffer.slot_;
        absl::lts_20250127::StrAppend(&local_148,(AlphaNum *)local_1c0);
        local_1c0._0_8_ =
             absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (*(int *)(local_168._0_8_ + 4),(Nonnull<char_*>)buffer.slot_);
        local_1c0._0_8_ = local_1c0._0_8_ + -(long)buffer.slot_;
        local_1c0._8_8_ = buffer.slot_;
        absl::lts_20250127::StrAppend((Nonnull<std::string_*>)&local_128,(AlphaNum *)local_1c0);
        std::__cxx11::string::_M_assign((string *)&local_108.default_generated_instance_);
      }
      local_e4._0_1_ = (pCVar8->options_).opensource_runtime;
      local_e4._1_1_ = (pCVar8->options_).annotate_code;
      local_e8._0_1_ = (pCVar8->options_).generate_immutable_code;
      local_e8._1_1_ = (pCVar8->options_).generate_mutable_code;
      local_e8._2_1_ = (pCVar8->options_).generate_shared_code;
      local_e8._3_1_ = (pCVar8->options_).enforce_lite;
      std::__cxx11::string::_M_assign((string *)&local_e0);
      std::__cxx11::string::_M_assign((string *)&local_c0);
      local_a0._0_1_ = (local_98->options_).strip_nonfunctional_codegen;
      local_a0._1_1_ = (local_98->options_).jvm_dsl;
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::compiler::java::FieldGeneratorInfo>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::compiler::java::FieldGeneratorInfo>>>
      ::try_emplace_impl<google::protobuf::FieldDescriptor_const*const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>::iterator,_bool>
                  *)local_1c0,this_01,(FieldDescriptor **)local_168);
      uVar5 = local_1c0._8_8_;
      std::__cxx11::string::_M_assign((string *)(local_1c0._8_8_ + 8));
      std::__cxx11::string::_M_assign((string *)(uVar5 + 0x28));
      std::__cxx11::string::_M_assign((string *)(uVar5 + 0x48));
      *(undefined2 *)(uVar5 + 0x6c) = local_e4;
      *(undefined4 *)(uVar5 + 0x68) = local_e8;
      std::__cxx11::string::_M_assign((string *)(uVar5 + 0x70));
      std::__cxx11::string::_M_assign((string *)(uVar5 + 0x90));
      *(undefined2 *)(uVar5 + 0xb0) = local_a0;
      pFVar12 = extraout_RDX_02;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
        pFVar12 = extraout_RDX_03;
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
        pFVar12 = extraout_RDX_04;
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108.default_value_enum_,CONCAT71(uStack_f7,local_f8) + 1);
        pFVar12 = extraout_RDX_05;
      }
      if (local_128.message_type != (Descriptor *)&local_118) {
        operator_delete(local_128.message_type,
                        (ulong)((long)&(local_118->super_Message).super_MessageLite.
                                       _vptr_MessageLite + 1));
        pFVar12 = extraout_RDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        pFVar12 = extraout_RDX_07;
      }
      uVar13 = uVar13 + 1;
      ppFVar11 = (fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(fields->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar11 >>
                             3));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  if (local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_190.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = CapitalizedFieldName(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = CapitalizedFieldName(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            absl::StrCat("capitalized name of field \"", field->name(),
                         "\" conflicts with field \"", other->name(), "\"");
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      ABSL_LOG(WARNING) << "field \"" << field->full_name()
                        << "\" is conflicting "
                        << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = CapitalizedFieldName(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      absl::StrAppend(&info.name, field->number());
      absl::StrAppend(&info.capitalized_name, field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    info.options = options_;
    field_generator_info_map_[field] = info;
  }
}